

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Window_Type.cxx
# Opt level: O1

int __thiscall Fl_Window_Type::read_fdesign(Fl_Window_Type *this,char *propname,char *value)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  Fl_Widget *pFVar4;
  int x;
  uint local_1c;
  
  ((this->super_Fl_Widget_Type).o)->box_ = '\0';
  iVar3 = strcmp(propname,"Width");
  if (iVar3 == 0) {
    iVar3 = __isoc99_sscanf(value,"%d",&local_1c);
    if (iVar3 != 1) {
      return 1;
    }
    pFVar4 = (this->super_Fl_Widget_Type).o;
    uVar1 = pFVar4->h_;
    uVar2 = local_1c;
  }
  else {
    iVar3 = strcmp(propname,"Height");
    if (iVar3 != 0) {
      iVar3 = strcmp(propname,"NumberofWidgets");
      if (iVar3 == 0) {
        return 1;
      }
      iVar3 = strcmp(propname,"border");
      if (iVar3 != 0) {
        iVar3 = strcmp(propname,"title");
        if (iVar3 == 0) {
          Fl_Type::label((Fl_Type *)this,value);
          return 1;
        }
        iVar3 = Fl_Widget_Type::read_fdesign(&this->super_Fl_Widget_Type,propname,value);
        return iVar3;
      }
      iVar3 = __isoc99_sscanf(value,"%d",&local_1c);
      if (iVar3 != 1) {
        return 1;
      }
      Fl_Window::border((Fl_Window *)(this->super_Fl_Widget_Type).o,local_1c);
      return 1;
    }
    iVar3 = __isoc99_sscanf(value,"%d",&local_1c);
    if (iVar3 != 1) {
      return 1;
    }
    pFVar4 = (this->super_Fl_Widget_Type).o;
    uVar2 = pFVar4->w_;
    uVar1 = local_1c;
  }
  (*pFVar4->_vptr_Fl_Widget[4])
            (pFVar4,(ulong)(uint)pFVar4->x_,(ulong)(uint)pFVar4->y_,(ulong)uVar2,(ulong)uVar1);
  return 1;
}

Assistant:

int Fl_Window_Type::read_fdesign(const char* propname, const char* value) {
  int x;
  o->box(FL_NO_BOX); // because fdesign always puts an Fl_Box next
  if (!strcmp(propname,"Width")) {
    if (sscanf(value,"%d",&x) == 1) o->size(x,o->h());
  } else if (!strcmp(propname,"Height")) {
    if (sscanf(value,"%d",&x) == 1) o->size(o->w(),x);
  } else if (!strcmp(propname,"NumberofWidgets")) {
    return 1; // we can figure out count from file
  } else if (!strcmp(propname,"border")) {
    if (sscanf(value,"%d",&x) == 1) ((Fl_Window*)o)->border(x);
  } else if (!strcmp(propname,"title")) {
    label(value);
  } else {
    return Fl_Widget_Type::read_fdesign(propname,value);
  }
  return 1;
}